

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlitePagerClose(Pager *pPager)

{
  jx9_vfs *pjVar1;
  jx9_vfs *pVfs;
  Pager *pPager_local;
  
  pager_release_kv_engine(pPager);
  if (((((pPager->iOpenFlags & 0x100) != 0) &&
       (pjVar1 = jx9ExportBuiltinVfs(), pjVar1 != (jx9_vfs *)0x0)) &&
      (pjVar1->xUnmap != (_func_void_void_ptr_jx9_int64 *)0x0)) && (pPager->pMmap != (void *)0x0)) {
    (*pjVar1->xUnmap)(pPager->pMmap,pPager->dbByteSize);
  }
  if ((pPager->is_mem == 0) && (-1 < pPager->iState)) {
    pager_unlock_db(pPager,0);
    unqliteOsCloseFree(pPager->pAllocator,pPager->pfd);
  }
  if (pPager->pVec != (Bitvec *)0x0) {
    unqliteBitvecDestroy(pPager->pVec);
    pPager->pVec = (Bitvec *)0x0;
  }
  return 0;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerClose(Pager *pPager)
{
	/* Release the KV engine */
	pager_release_kv_engine(pPager);
	if( pPager->iOpenFlags & UNQLITE_OPEN_MMAP ){
		const jx9_vfs *pVfs = jx9ExportBuiltinVfs();
		if( pVfs && pVfs->xUnmap && pPager->pMmap ){
			pVfs->xUnmap(pPager->pMmap,pPager->dbByteSize);
		}
	}
	if( !pPager->is_mem && pPager->iState >= PAGER_OPEN ){
		/* Release all lock on this database handle. The issue is
		 * discussed at https://github.com/symisc/unqlite/issues/74.
		 */
		pager_unlock_db(pPager,NO_LOCK);
		/* Close the file  */
		unqliteOsCloseFree(pPager->pAllocator,pPager->pfd);
	}
	if( pPager->pVec ){
		unqliteBitvecDestroy(pPager->pVec);
		pPager->pVec = 0;
	}
	return UNQLITE_OK;
}